

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int xmlAttrHashInsert(xmlParserCtxtPtr ctxt,uint size,xmlChar *name,xmlChar *uri,uint hashValue,
                     int aindex)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlAttrHashBucket *pxVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar5 = (ulong)(size - 1 & hashValue);
  pxVar3 = ctxt->attrHash + uVar5;
  uVar4 = pxVar3->index;
  if (-1 < (int)uVar4) {
    do {
      if (ctxt->atts[uVar4] == name) {
        iVar1 = *(int *)(ctxt->atts + (ulong)uVar4 + 2);
        if (iVar1 == 0x7ffffffe) {
          pxVar2 = ctxt->str_xml_ns;
        }
        else {
          if (iVar1 == 0x7fffffff) {
            if (uri == (xmlChar *)0x0) {
              return uVar4;
            }
            goto LAB_00141190;
          }
          pxVar2 = ctxt->nsTab[iVar1 * 2 + 1];
        }
        if (pxVar2 == uri) {
          return uVar4;
        }
      }
LAB_00141190:
      uVar4 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar4;
      pxVar3 = pxVar3 + 1;
      if (size <= uVar4) {
        uVar5 = 0;
        pxVar3 = ctxt->attrHash;
      }
      uVar4 = pxVar3->index;
    } while (-1 < (int)uVar4);
  }
  pxVar3->index = aindex;
  return 0x7fffffff;
}

Assistant:

static int
xmlAttrHashInsert(xmlParserCtxtPtr ctxt, unsigned size, const xmlChar *name,
                  const xmlChar *uri, unsigned hashValue, int aindex) {
    xmlAttrHashBucket *table = ctxt->attrHash;
    xmlAttrHashBucket *bucket;
    unsigned hindex;

    hindex = hashValue & (size - 1);
    bucket = &table[hindex];

    while (bucket->index >= 0) {
        const xmlChar **atts = &ctxt->atts[bucket->index];

        if (name == atts[0]) {
            int nsIndex = XML_PTR_TO_INT(atts[2]);

            if ((nsIndex == NS_INDEX_EMPTY) ? (uri == NULL) :
                (nsIndex == NS_INDEX_XML) ? (uri == ctxt->str_xml_ns) :
                (uri == ctxt->nsTab[nsIndex * 2 + 1]))
                return(bucket->index);
        }

        hindex++;
        bucket++;
        if (hindex >= size) {
            hindex = 0;
            bucket = table;
        }
    }

    bucket->index = aindex;

    return(INT_MAX);
}